

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_cfg.c
# Opt level: O0

int oonf_cfg_rollback(void)

{
  cfg_db *pcVar1;
  cfg_db *pcVar2;
  int iVar3;
  cfg_db *db;
  cfg_db *dst;
  cfg_db *local_10;
  
  pcVar1 = _oonf_raw_db;
  if ((log_global_mask[3] & 2) != 0) {
    oonf_log(LOG_SEVERITY_INFO,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x1b7,(void *)0x0,0,
             "Rollback configuration");
  }
  pcVar2 = _oonf_work_db;
  local_10 = (cfg_db *)cfg_db_add();
  if ((local_10 != (cfg_db *)0x0) && (iVar3 = _cfg_db_append(local_10,pcVar2,0,0), iVar3 != 0)) {
    cfg_db_remove(local_10);
    local_10 = (cfg_db *)0x0;
  }
  _oonf_raw_db = local_10;
  if (local_10 == (cfg_db *)0x0) {
    if ((log_global_mask[3] & 4) != 0) {
      oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x1bb,(void *)0x0,0,
               "Cannot create raw configuration database.");
    }
    db._4_4_ = -1;
    _oonf_raw_db = pcVar1;
  }
  else {
    cfg_db_remove(pcVar1);
    db._4_4_ = 0;
  }
  return db._4_4_;
}

Assistant:

int
oonf_cfg_rollback(void) {
  struct cfg_db *db;

  /* remember old db */
  db = _oonf_raw_db;

  OONF_INFO(LOG_CONFIG, "Rollback configuration");

  _oonf_raw_db = cfg_db_duplicate(_oonf_work_db);
  if (_oonf_raw_db == NULL) {
    OONF_WARN(LOG_CONFIG, "Cannot create raw configuration database.");
    _oonf_raw_db = db;
    return -1;
  }

  /* free old db */
  cfg_db_remove(db);
  return 0;
}